

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDimple::DeleteComponents
          (ON_SubDimple *this,uint level_index,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  unsigned_short uVar1;
  ushort uVar2;
  undefined2 uVar28;
  undefined2 uVar29;
  undefined2 uVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDVertex *pOVar5;
  ulong uVar6;
  ON_SubDFace *pOVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  unsigned_short uVar12;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ON_SubDFacePtr *pOVar13;
  short sVar14;
  ON_SubDEdge *pOVar15;
  ON_SubDimple *this_00;
  uint uVar16;
  ON_SubDEdgePtr *pOVar17;
  ON_SubDFacePtr *pOVar18;
  undefined7 in_register_00000081;
  ulong uVar19;
  ushort uVar20;
  ON_SubDHeap *pOVar21;
  byte bVar22;
  ON_SubDHeap *pOVar23;
  ON_SubDVertex *pOVar24;
  ulong uVar25;
  ON_SubDLevel *pOVar26;
  bool bVar27;
  ON_ComponentStatus allsetcheck;
  ON_ComponentStatus local_72;
  uint local_70;
  undefined4 local_6c;
  double local_68;
  ON_SubDimple *local_60;
  ON_SubDLevel *local_58;
  undefined4 local_4c;
  ON_SubDHeap *local_48;
  uint local_3c;
  ON_SubDHeap *local_38;
  
  local_70 = (uint)CONCAT71(in_register_00000081,bMarkDeletedFaceEdges);
  local_6c = (undefined4)CONCAT71(in_register_00000011,bDeleteIsolatedEdges);
  if ((level_index < (uint)(this->m_levels).m_count) &&
     (pOVar26 = (this->m_levels).m_a[level_index], pOVar26 != (ON_SubDLevel *)0x0)) {
    local_4c = (undefined4)CONCAT71(in_register_00000009,bUpdateTagsAndCoefficients);
    local_3c = level_index;
    if (bMarkDeletedFaceEdges) {
      for (pOVar15 = pOVar26->m_edge[0]; pOVar15 != (ON_SubDEdge *)0x0;
          pOVar15 = pOVar15->m_next_edge) {
        ON_ComponentStatus::ClearRuntimeMark(&(pOVar15->super_ON_SubDComponentBase).m_status);
      }
    }
    local_60 = this;
    local_58 = pOVar26;
    if ((ON_SubDHeap *)pOVar26->m_face[0] == (ON_SubDHeap *)0x0) {
      iVar10 = 0;
    }
    else {
      local_38 = &this->m_heap;
      iVar10 = 0;
      pOVar23 = (ON_SubDHeap *)pOVar26->m_face[0];
      do {
        local_68 = (double)CONCAT44(local_68._4_4_,iVar10);
        pOVar21 = (ON_SubDHeap *)(pOVar23->m_fspe).m_al_element_stack;
        bVar9 = ON_ComponentStatus::operator==
                          (&ON_ComponentStatus::AllSet,
                           (ON_ComponentStatus *)&(pOVar23->m_fspv).m_al_element_stack);
        bVar27 = true;
        if (!bVar9) {
          bVar27 = *(unsigned_short *)((long)&(pOVar23->m_fspf).m_first_block + 4) == 0;
        }
        if (bVar27) {
LAB_005ee519:
          if (((byte)local_70 != '\0') &&
             (*(unsigned_short *)((long)&(pOVar23->m_fspf).m_first_block + 4) != 0)) {
            pOVar17 = (ON_SubDEdgePtr *)&(pOVar23->m_fspf).m_al_element_stack;
            uVar20 = 0;
            do {
              if ((uVar20 == 4) &&
                 (pOVar17 = (ON_SubDEdgePtr *)(pOVar23->m_fspf).m_sizeof_element,
                 pOVar17 == (ON_SubDEdgePtr *)0x0)) break;
              uVar25 = pOVar17->m_ptr & 0xfffffffffffffff8;
              if (uVar25 != 0) {
                ON_ComponentStatus::SetRuntimeMark((ON_ComponentStatus *)(uVar25 + 0x10));
              }
              uVar20 = uVar20 + 1;
              pOVar17 = pOVar17 + 1;
            } while (uVar20 < *(unsigned_short *)((long)&(pOVar23->m_fspf).m_first_block + 4));
          }
          ON_SubDLevel::RemoveFace(pOVar26,(ON_SubDFace *)pOVar23);
          ON_SubDHeap::ReturnFace(local_38,(ON_SubDFace *)pOVar23);
          iVar10 = local_68._0_4_ + 1;
        }
        else {
          bVar27 = true;
          local_48 = pOVar21;
          if (*(unsigned_short *)((long)&(pOVar23->m_fspf).m_first_block + 4) != 0) {
            pOVar17 = (ON_SubDEdgePtr *)&(pOVar23->m_fspf).m_al_element_stack;
            uVar20 = 1;
            bVar9 = false;
            do {
              if ((uVar20 == 5) &&
                 (pOVar17 = (ON_SubDEdgePtr *)(pOVar23->m_fspf).m_sizeof_element,
                 pOVar17 == (ON_SubDEdgePtr *)0x0)) break;
              uVar25 = pOVar17->m_ptr & 0xfffffffffffffff8;
              if (uVar25 == 0) {
LAB_005ee4e0:
                bVar9 = true;
              }
              else if ((((*(long *)(uVar25 + 0x80) == 0) || (*(long *)(uVar25 + 0x88) == 0)) ||
                       (bVar27 = ON_ComponentStatus::operator==
                                           (&ON_ComponentStatus::AllSet,
                                            (ON_ComponentStatus *)(uVar25 + 0x10)), bVar27)) ||
                      ((bVar27 = ON_ComponentStatus::operator==
                                           (&ON_ComponentStatus::AllSet,
                                            (ON_ComponentStatus *)(*(long *)(uVar25 + 0x80) + 0x10))
                       , bVar27 ||
                       (bVar27 = ON_ComponentStatus::operator==
                                           (&ON_ComponentStatus::AllSet,
                                            (ON_ComponentStatus *)(*(long *)(uVar25 + 0x88) + 0x10))
                       , bVar27)))) {
                bVar27 = ON_ComponentStatus::operator!=
                                   (&ON_ComponentStatus::AllSet,
                                    (ON_ComponentStatus *)(uVar25 + 0x10));
                if (bVar27) {
                  *(ON_ComponentStatus *)(uVar25 + 0x10) = ON_ComponentStatus::AllSet;
                }
                goto LAB_005ee4e0;
              }
              bVar27 = !bVar9;
              if (*(unsigned_short *)((long)&(pOVar23->m_fspf).m_first_block + 4) <= uVar20) break;
              pOVar17 = pOVar17 + 1;
              uVar20 = uVar20 + 1;
            } while (!bVar9);
          }
          pOVar21 = local_48;
          pOVar26 = local_58;
          if (!bVar27) goto LAB_005ee519;
          iVar10 = local_68._0_4_;
        }
        pOVar23 = pOVar21;
      } while (pOVar21 != (ON_SubDHeap *)0x0);
    }
    local_68 = (double)CONCAT44(local_68._4_4_,iVar10);
    local_72.m_status_flags = '\0';
    local_72.m_mark_bits = '\0';
    if (pOVar26->m_edge[0] != (ON_SubDEdge *)0x0) {
      bVar22 = (byte)local_6c ^ 1;
      local_48 = &local_60->m_heap;
      local_70 = CONCAT31(local_70._1_3_,(byte)local_6c) ^ 1;
      pOVar15 = pOVar26->m_edge[0];
      do {
        pOVar4 = pOVar15->m_next_edge;
        uVar28._0_1_ = (pOVar15->super_ON_SubDComponentBase).m_status.m_status_flags;
        uVar28._1_1_ = (pOVar15->super_ON_SubDComponentBase).m_status.m_mark_bits;
        local_72 = ON_ComponentStatus::LogicalAnd
                             (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar28);
        bVar27 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_72);
        if (!bVar27 && bVar22 == 0) {
          bVar27 = pOVar15->m_face_count == 0;
        }
        if (bVar27 == false) {
          sVar14 = 0;
          bVar27 = false;
          do {
            if ((((pOVar15->m_vertex[0] == (ON_SubDVertex *)0x0) ||
                 (pOVar15->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
                (bVar9 = ON_ComponentStatus::operator==
                                   (&ON_ComponentStatus::AllSet,
                                    &(pOVar15->m_vertex[0]->super_ON_SubDComponentBase).m_status),
                bVar9)) ||
               (bVar9 = ON_ComponentStatus::operator==
                                  (&ON_ComponentStatus::AllSet,
                                   &(pOVar15->m_vertex[1]->super_ON_SubDComponentBase).m_status),
               bVar9)) {
              bVar27 = true;
            }
            bVar9 = sVar14 == 0;
            sVar14 = sVar14 + -1;
          } while ((bVar9) && (!bVar27));
          bVar22 = (byte)local_70;
          if (bVar27) goto LAB_005ee670;
        }
        else {
LAB_005ee670:
          ON_SubDLevel::RemoveEdge(local_58,pOVar15);
          ON_SubDHeap::ReturnEdge(local_48,pOVar15);
          local_68 = (double)CONCAT44(local_68._4_4_,local_68._0_4_ + 1);
        }
        pOVar15 = pOVar4;
      } while (pOVar4 != (ON_SubDEdge *)0x0);
    }
    uVar16 = local_68._0_4_;
    if (local_58->m_vertex[0] != (ON_SubDVertex *)0x0) {
      pOVar23 = &local_60->m_heap;
      pOVar24 = local_58->m_vertex[0];
      do {
        pOVar5 = pOVar24->m_next_vertex;
        uVar29._0_1_ = (pOVar24->super_ON_SubDComponentBase).m_status.m_status_flags;
        uVar29._1_1_ = (pOVar24->super_ON_SubDComponentBase).m_status.m_mark_bits;
        local_72 = ON_ComponentStatus::LogicalAnd
                             (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar29);
        bVar27 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_72);
        if (((bVar27) || (((byte)local_6c != '\0' && (pOVar24->m_face_count == 0)))) ||
           (pOVar24->m_edge_count == 0)) {
          ON_SubDLevel::RemoveVertex(local_58,pOVar24);
          ON_SubDHeap::ReturnVertex(pOVar23,pOVar24);
          uVar16 = uVar16 + 1;
        }
        pOVar24 = pOVar5;
      } while (pOVar5 != (ON_SubDVertex *)0x0);
    }
    uVar8 = local_4c;
    pOVar26 = local_58;
    if (uVar16 != 0) {
      if (local_58->m_edge[0] != (ON_SubDEdge *)0x0) {
        pOVar23 = &local_60->m_heap;
        local_68 = -8883.0;
        pOVar15 = local_58->m_edge[0];
        do {
          pOVar4 = pOVar15->m_next_edge;
          uVar1 = pOVar15->m_face_count;
          pOVar15->m_face_count = 0;
          if (uVar1 != 0) {
            pOVar13 = pOVar15->m_face2;
            uVar12 = 0;
            pOVar18 = pOVar13;
            do {
              if (uVar12 == 2) {
                pOVar18 = pOVar15->m_facex;
              }
              uVar25 = pOVar18->m_ptr & 0xfffffffffffffff8;
              if ((uVar25 != 0) && (*(int *)(uVar25 + 0xc) != -1)) {
                pOVar13->m_ptr = pOVar18->m_ptr;
                uVar3 = pOVar15->m_face_count;
                pOVar15->m_face_count = uVar3 + 1;
                if ((unsigned_short)(uVar3 + 1) == 2) {
                  pOVar13 = pOVar15->m_facex;
                }
                else {
                  pOVar13 = pOVar13 + 1;
                }
              }
              uVar12 = uVar12 + 1;
              pOVar18 = pOVar18 + 1;
            } while (uVar1 != uVar12);
          }
          if (((byte)local_6c & pOVar15->m_face_count == 0) == 0) {
            if ((pOVar15->m_face_count < 3) && (pOVar15->m_facex != (ON_SubDFacePtr *)0x0)) {
              ON_SubDHeap::ReturnEdgeExtraArray(pOVar23,pOVar15);
            }
            if ((char)uVar8 != '\0') {
              if (pOVar15->m_face_count != 2) {
                pOVar15->m_edge_tag = Crease;
              }
              pOVar15->m_sector_coefficient[0] = local_68;
              pOVar15->m_sector_coefficient[1] = local_68;
            }
          }
          else {
            ON_SubDLevel::RemoveEdge(pOVar26,pOVar15);
            ON_SubDHeap::ReturnEdge(pOVar23,pOVar15);
            uVar16 = uVar16 + 1;
          }
          pOVar15 = pOVar4;
        } while (pOVar4 != (ON_SubDEdge *)0x0);
      }
      if (pOVar26->m_vertex[0] != (ON_SubDVertex *)0x0) {
        pOVar23 = &local_60->m_heap;
        pOVar24 = pOVar26->m_vertex[0];
        do {
          pOVar5 = pOVar24->m_next_vertex;
          uVar20 = pOVar24->m_edge_count;
          pOVar24->m_edge_count = 0;
          if ((ulong)uVar20 == 0) {
            bVar27 = false;
            uVar11 = 0;
          }
          else {
            pOVar17 = pOVar24->m_edges;
            bVar27 = true;
            uVar25 = 0;
            uVar11 = 0;
            do {
              uVar6 = pOVar17[uVar25].m_ptr;
              uVar19 = uVar6 & 0xfffffffffffffff8;
              if ((uVar19 == 0) || (*(int *)(uVar19 + 0xc) == -1)) {
                bVar27 = false;
              }
              else {
                uVar11 = uVar11 + (*(char *)(uVar19 + 0x60) == '\x02');
                if (*(short *)(uVar19 + 100) != 2) {
                  bVar27 = false;
                }
                uVar2 = pOVar24->m_edge_count;
                pOVar24->m_edge_count = uVar2 + 1;
                pOVar17[uVar2].m_ptr = uVar6;
              }
              uVar25 = uVar25 + 1;
            } while (uVar20 != uVar25);
            bVar27 = !bVar27;
          }
          uVar20 = pOVar24->m_face_count;
          pOVar24->m_face_count = 0;
          if ((ulong)uVar20 != 0) {
            uVar25 = 0;
            do {
              pOVar7 = pOVar24->m_faces[uVar25];
              if ((pOVar7 != (ON_SubDFace *)0x0) &&
                 ((pOVar7->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
                uVar2 = pOVar24->m_face_count;
                pOVar24->m_face_count = uVar2 + 1;
                pOVar24->m_faces[uVar2] = pOVar7;
              }
              uVar25 = uVar25 + 1;
            } while (uVar20 != uVar25);
          }
          if ((pOVar24->m_face_count == 0) && (pOVar24->m_edge_count == 0)) {
            ON_SubDLevel::RemoveVertex(pOVar26,pOVar24);
            ON_SubDHeap::ReturnVertex(pOVar23,pOVar24);
            uVar16 = uVar16 + 1;
          }
          else if (((uVar11 == 1) && ((pOVar24->m_face_count == 0 && (pOVar24->m_edge_count == 1))))
                  || (2 < uVar11)) {
            pOVar24->m_vertex_tag = Corner;
          }
          else if (((bool)(bVar27 | uVar11 == 2)) && ((pOVar24->m_vertex_tag & ~Smooth) != Crease))
          {
            pOVar24->m_vertex_tag = Crease;
          }
          pOVar24 = pOVar5;
        } while (pOVar5 != (ON_SubDVertex *)0x0);
      }
      this_00 = local_60;
      if (((pOVar26->m_vertex_count == 0) || (pOVar26->m_edge_count == 0)) ||
         (((byte)local_6c != '\0' && (pOVar26->m_face_count == 0)))) {
        Destroy(local_60);
      }
      else {
        ON_AggregateComponentStatusEx::MarkAsNotCurrent(&(pOVar26->m_aggregates).m_aggregate_status)
        ;
        ON_SubDLevel::ClearEvaluationCache(pOVar26);
        this_00 = local_60;
        ClearHigherSubdivisionLevels(local_60,local_3c);
        if ((char)local_4c != '\0') {
          ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(pOVar26,false);
        }
      }
      ChangeGeometryContentSerialNumber(this_00,false);
      return uVar16;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  return 0;
}

Assistant:

unsigned int ON_SubDimple::DeleteComponents(
  unsigned int level_index,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
  )
{ 
  unsigned int deleted_component_count = 0;

  if (level_index >= m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(0);

  ON_SubDLevel* level = m_levels[level_index];
  if (nullptr == level)
    return ON_SUBD_RETURN_ERROR(0);

  if (bMarkDeletedFaceEdges)
    level->ClearRuntimeMarks(false,true,false);

  ON_SubDFace* next_face = level->m_face[0];
  for (ON_SubDFace* face = next_face; nullptr != face; face = next_face)
  {
    next_face = const_cast< ON_SubDFace* >(face->m_next_face);
    bool bDelete = (ON_ComponentStatus::AllSet == face->m_status || 0 == face->m_edge_count);
    if (false == bDelete)
    {
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count && false == bDelete; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == edge
          || nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
        {
          bDelete = true;
          if (nullptr != edge && ON_ComponentStatus::AllSet != edge->m_status)
            edge->m_status = ON_ComponentStatus::AllSet;
        }
      }
      if (false == bDelete)
        continue;
    }

    if (bMarkDeletedFaceEdges)
    {
      // Set runtime mark on face's boundary edges.
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count ; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr != edge)
          edge->m_status.SetRuntimeMark();
      }
    }

    level->RemoveFace(face);
    m_heap.ReturnFace(face);
    deleted_component_count++;
  }

  ON_ComponentStatus allsetcheck;
  ON_SubDEdge* next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast< ON_SubDEdge* >(edge->m_next_edge);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, edge->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == edge->m_face_count) );
    if (false == bDelete)
    {
      for (unsigned short evi = 0; evi < 2 && false == bDelete; evi++)
      {
        if (nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
          bDelete = true;
      }
      if (false == bDelete)
        continue;
    }

    level->RemoveEdge(edge);
    m_heap.ReturnEdge(edge);
    deleted_component_count++;
  }

  ON_SubDVertex* next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, vertex->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == vertex->m_face_count) || 0 == vertex->m_edge_count );
    if ( false == bDelete )
      continue;

    level->RemoveVertex(vertex);
    m_heap.ReturnVertex(vertex);
    deleted_component_count++;
  }

  if ( 0 == deleted_component_count )
    return 0;

  // Remove edge references to deleted faces
  next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);
    ON_SubDFacePtr* fptr0 = edge->m_face2;
    ON_SubDFacePtr* fptr1 = edge->m_face2;
    const unsigned short edge_face_count = edge->m_face_count;
    edge->m_face_count = 0;
    for (unsigned short efi = 0; efi < edge_face_count; efi++, fptr0++)
    {
      if (2 == efi)
        fptr0 = edge->m_facex;
      const ON_SubDFace* face = fptr0->Face();
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId())
        continue;
      *fptr1++ = *fptr0;
      edge->m_face_count++;
      if (2 == edge->m_face_count)
        fptr1 = edge->m_facex;
    }

    if (0 == edge->m_face_count && bDeleteIsolatedEdges)
    {
      level->RemoveEdge(edge);
      m_heap.ReturnEdge(edge);
      deleted_component_count++;
      continue;
    }
    
    if (edge->m_face_count <= 2 && nullptr != edge->m_facex)
      m_heap.ReturnEdgeExtraArray(edge);

    if (bUpdateTagsAndCoefficients)
    {
      if (edge->m_face_count != 2)
        edge->m_edge_tag = ON_SubDEdgeTag::Crease;

      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
    }
  }

  // Remove vertex references to deleted edges and faces
  next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    unsigned int count = vertex->m_edge_count;
    vertex->m_edge_count = 0;

    bool bInteriorVertex = true;
    unsigned int crease_count = 0;
    for (unsigned short vei = 0; vei < count; vei++)
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
      if (nullptr == edge || ON_UNSET_UINT_INDEX == edge->ArchiveId())
      {
        bInteriorVertex = false;
        continue;
      }
      if (edge->IsCrease())
        crease_count++;
      if (2 != edge->m_face_count)
        bInteriorVertex = false;
      vertex->m_edges[vertex->m_edge_count++] = vertex->m_edges[vei];
    }


    count = vertex->m_face_count;
    vertex->m_face_count = 0;
    for (unsigned short vfi = 0; vfi < count; vfi++)
    {
      const ON_SubDFace* face = vertex->m_faces[vfi];
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId()) 
        continue;
      vertex->m_faces[vertex->m_face_count++] = vertex->m_faces[vfi];
    }

    if (0 == vertex->m_face_count && 0 == vertex->m_edge_count)
    {
      level->RemoveVertex(vertex);
      m_heap.ReturnVertex(vertex);
      deleted_component_count++;
    }
    else
    {
      if (1 == crease_count && 1 == vertex->m_edge_count && 0 == vertex->m_face_count)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (crease_count > 2)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (false == bInteriorVertex || crease_count > 1)
      {
        if (false == vertex->IsCreaseOrCorner())
          vertex->m_vertex_tag = ON_SubDVertexTag::Crease;
      }
    }
  }

  if (0 == level->m_vertex_count || 0 == level->m_edge_count || (bDeleteIsolatedEdges && 0 == level->m_face_count))
  {
    Destroy();
  }
  else
  {
    // remove all information that is no longer valid
    level->MarkAggregateComponentStatusAsNotCurrent();
    level->ClearEvaluationCache();

    ClearHigherSubdivisionLevels(level_index);

    if (bUpdateTagsAndCoefficients)
    {
      // Update vertex tags, edge tags, and sector coefficients.
      level->UpdateAllTagsAndSectorCoefficients(false);
    }
  }

  ChangeGeometryContentSerialNumber(false);

  return deleted_component_count;
}